

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O2

void * floor1_inverse1(vorbis_block *vb,vorbis_look_floor *in)

{
  oggpack_buffer *b;
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 *puVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  int local_74;
  
  piVar2 = *(int **)((long)in + 0x308);
  lVar10 = *(long *)((long)vb->vd->vi->codec_setup + 0x1428);
  b = &vb->opb;
  lVar5 = oggpack_read(b,1);
  if (lVar5 == 1) {
    puVar6 = (undefined4 *)_vorbis_block_alloc(vb,(long)*(int *)((long)in + 0x2fc) << 2);
    iVar3 = ilog(*(int *)((long)in + 0x304) - 1);
    lVar5 = oggpack_read(b,iVar3);
    *puVar6 = (int)lVar5;
    iVar3 = ilog(*(int *)((long)in + 0x304) - 1);
    lVar5 = oggpack_read(b,iVar3);
    puVar6[1] = (int)lVar5;
    local_74 = 2;
    for (lVar5 = 0; lVar5 < *piVar2; lVar5 = lVar5 + 1) {
      lVar17 = (long)piVar2[lVar5 + 1];
      uVar1 = piVar2[lVar17 + 0x20];
      iVar3 = piVar2[lVar17 + 0x30];
      if (iVar3 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = vorbis_book_decode((codebook *)((long)piVar2[lVar17 + 0x40] * 0x60 + lVar10),b);
        if ((int)uVar7 == -1) goto LAB_0011fd45;
      }
      bVar9 = (byte)iVar3;
      uVar12 = 0;
      if (0 < (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
      for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
        uVar11 = (uint)uVar7;
        uVar7 = (ulong)(uint)((int)uVar11 >> (bVar9 & 0x1f));
        if ((long)piVar2[lVar17 * 8 + (ulong)(uVar11 & ~(-1 << (bVar9 & 0x1f))) + 0x50] < 0) {
          puVar6[(long)local_74 + uVar13] = 0;
        }
        else {
          lVar8 = vorbis_book_decode((codebook *)
                                     ((long)piVar2[lVar17 * 8 +
                                                   (ulong)(uVar11 & ~(-1 << (bVar9 & 0x1f))) + 0x50]
                                      * 0x60 + lVar10),b);
          puVar6[(long)local_74 + uVar13] = (int)lVar8;
          if ((int)lVar8 == -1) goto LAB_0011fd45;
        }
      }
      local_74 = local_74 + uVar1;
    }
    for (lVar10 = 0; lVar10 + 2 < (long)*(int *)((long)in + 0x2fc); lVar10 = lVar10 + 1) {
      lVar5 = (long)*(int *)((long)in + lVar10 * 4 + 0x200);
      lVar17 = (long)*(int *)((long)in + lVar10 * 4 + 0x104);
      iVar14 = (puVar6[lVar17] & 0x7fff) - (puVar6[lVar5] & 0x7fff);
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar4 = ((piVar2[lVar10 + 0xd3] - piVar2[lVar5 + 0xd1]) * iVar3) /
              (piVar2[lVar17 + 0xd1] - piVar2[lVar5 + 0xd1]);
      iVar3 = -iVar4;
      if (-1 < iVar14) {
        iVar3 = iVar4;
      }
      uVar11 = iVar3 + (puVar6[lVar5] & 0x7fff);
      uVar1 = puVar6[lVar10 + 2];
      if (uVar1 == 0) {
        puVar6[lVar10 + 2] = uVar11 | 0x8000;
      }
      else {
        uVar15 = *(int *)((long)in + 0x304) - uVar11;
        uVar16 = uVar11;
        if ((int)uVar15 < (int)uVar11) {
          uVar16 = uVar15;
        }
        if (SBORROW4(uVar1,uVar16 * 2) == (int)(uVar1 + uVar16 * -2) < 0) {
          if ((int)uVar11 < (int)uVar15) {
            iVar3 = uVar1 - uVar11;
          }
          else {
            iVar3 = ~uVar1 + uVar15;
          }
        }
        else if ((uVar1 & 1) == 0) {
          iVar3 = (int)uVar1 >> 1;
        }
        else {
          iVar3 = -((int)(uVar1 + 1) >> 1);
        }
        puVar6[lVar10 + 2] = iVar3 + uVar11;
        puVar6[*(int *)((long)in + lVar10 * 4 + 0x200)] =
             puVar6[*(int *)((long)in + lVar10 * 4 + 0x200)] & 0x7fff;
        puVar6[*(int *)((long)in + lVar10 * 4 + 0x104)] =
             puVar6[*(int *)((long)in + lVar10 * 4 + 0x104)] & 0x7fff;
      }
    }
  }
  else {
LAB_0011fd45:
    puVar6 = (undefined4 *)0x0;
  }
  return puVar6;
}

Assistant:

static void *floor1_inverse1(vorbis_block *vb,vorbis_look_floor *in){
  vorbis_look_floor1 *look=(vorbis_look_floor1 *)in;
  vorbis_info_floor1 *info=look->vi;
  codec_setup_info   *ci=(codec_setup_info *)vb->vd->vi->codec_setup;
  
  int i,j,k;
  codebook *books=ci->fullbooks;   
  
  /* unpack wrapped/predicted values from stream */
  if(oggpack_read(&vb->opb,1)==1){
    int *fit_value=(int *)_vorbis_block_alloc(vb,(look->posts)*sizeof(*fit_value));
    
    fit_value[0]=oggpack_read(&vb->opb,ilog(look->quant_q-1));
    fit_value[1]=oggpack_read(&vb->opb,ilog(look->quant_q-1));
    
    /* partition by partition */
    /* partition by partition */
    for(i=0,j=2;i<info->partitions;i++){
      int classv=info->partitionclass[i];
      int cdim=info->class_dim[classv];
      int csubbits=info->class_subs[classv];
      int csub=1<<csubbits;
      int cval=0;

      /* decode the partition's first stage cascade value */
      if(csubbits){
	cval=vorbis_book_decode(books+info->class_book[classv],&vb->opb);

	if(cval==-1)goto eop;
      }

      for(k=0;k<cdim;k++){
	int book=info->class_subbook[classv][cval&(csub-1)];
	cval>>=csubbits;
	if(book>=0){
	  if((fit_value[j+k]=vorbis_book_decode(books+book,&vb->opb))==-1)
	    goto eop;
	}else{
	  fit_value[j+k]=0;
	}
      }
      j+=cdim;
    }

    /* unwrap positive values and reconsitute via linear interpolation */
    for(i=2;i<look->posts;i++){
      int predicted=render_point(info->postlist[look->loneighbor[i-2]],
				 info->postlist[look->hineighbor[i-2]],
				 fit_value[look->loneighbor[i-2]],
				 fit_value[look->hineighbor[i-2]],
				 info->postlist[i]);
      int hiroom=look->quant_q-predicted;
      int loroom=predicted;
      int room=(hiroom<loroom?hiroom:loroom)<<1;
      int val=fit_value[i];

      if(val){
	if(val>=room){
	  if(hiroom>loroom){
	    val = val-loroom;
	  }else{
	  val = -1-(val-hiroom);
	  }
	}else{
	  if(val&1){
	    val= -((val+1)>>1);
	  }else{
	    val>>=1;
	  }
	}

	fit_value[i]=val+predicted;
	fit_value[look->loneighbor[i-2]]&=0x7fff;
	fit_value[look->hineighbor[i-2]]&=0x7fff;

      }else{
	fit_value[i]=predicted|0x8000;
      }
	
    }

    return(fit_value);
  }
 eop:
  return(NULL);
}